

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cc
# Opt level: O0

Texture * __thiscall SDL2pp::Texture::Update(Texture *this,Optional<Rect> *rect,Surface *surface)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int h;
  Uint32 UVar4;
  Uint32 UVar5;
  value_type *pvVar6;
  int *piVar7;
  void *pvVar8;
  optional<SDL2pp::Rect> local_9c;
  undefined1 local_88 [8];
  LockHandle lock_1;
  Surface converted;
  optional<SDL2pp::Rect> local_5c;
  LockHandle lock;
  undefined1 local_38 [8];
  Rect real_rect;
  Surface *surface_local;
  Optional<Rect> *rect_local;
  Texture *this_local;
  
  real_rect.super_SDL_Rect._8_8_ = surface;
  bVar2 = sdl2pp_libcpp_optional::optional::operator_cast_to_bool((optional *)rect);
  if (bVar2) {
    pvVar6 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(rect);
    local_38._0_4_ = (pvVar6->super_SDL_Rect).x;
    local_38._4_4_ = (pvVar6->super_SDL_Rect).y;
    real_rect.super_SDL_Rect.x = (pvVar6->super_SDL_Rect).w;
    real_rect.super_SDL_Rect.y = (pvVar6->super_SDL_Rect).h;
  }
  else {
    iVar3 = GetWidth(this);
    h = GetHeight(this);
    Rect::Rect((Rect *)local_38,0,0,iVar3,h);
  }
  lock.surface_._4_4_ = Surface::GetWidth((Surface *)real_rect.super_SDL_Rect._8_8_);
  piVar7 = std::min<int>((int *)&real_rect,(int *)((long)&lock.surface_ + 4));
  real_rect.super_SDL_Rect.x = *piVar7;
  lock.surface_._0_4_ = Surface::GetHeight((Surface *)real_rect.super_SDL_Rect._8_8_);
  piVar7 = std::min<int>(&real_rect.super_SDL_Rect.y,(int *)&lock);
  real_rect.super_SDL_Rect.y = *piVar7;
  UVar4 = GetFormat(this);
  UVar5 = Surface::GetFormat((Surface *)real_rect.super_SDL_Rect._8_8_);
  uVar1 = real_rect.super_SDL_Rect._8_8_;
  if (UVar4 == UVar5) {
    Surface::Lock((Surface *)&stack0xffffffffffffffb8);
    sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::optional(&local_5c,(value_type *)local_38);
    pvVar8 = Surface::LockHandle::GetPixels((LockHandle *)&stack0xffffffffffffffb8);
    iVar3 = Surface::LockHandle::GetPitch((LockHandle *)&stack0xffffffffffffffb8);
    this_local = Update(this,&local_5c,pvVar8,iVar3);
    Surface::LockHandle::~LockHandle((LockHandle *)&stack0xffffffffffffffb8);
  }
  else {
    GetFormat(this);
    Surface::Convert((Surface *)&lock_1,(Uint32)uVar1);
    Surface::Lock((Surface *)local_88);
    sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::optional(&local_9c,(value_type *)local_38);
    pvVar8 = Surface::LockHandle::GetPixels((LockHandle *)local_88);
    iVar3 = Surface::LockHandle::GetPitch((LockHandle *)local_88);
    this_local = Update(this,&local_9c,pvVar8,iVar3);
    Surface::LockHandle::~LockHandle((LockHandle *)local_88);
    Surface::~Surface((Surface *)&lock_1);
  }
  return this_local;
}

Assistant:

Texture& Texture::Update(const Optional<Rect>& rect, Surface&& surface) {
	Rect real_rect = rect ? *rect : Rect(0, 0, GetWidth(), GetHeight());

	real_rect.w = std::min(real_rect.w, surface.GetWidth());
	real_rect.h = std::min(real_rect.h, surface.GetHeight());

	if (GetFormat() == surface.GetFormat()) {
		Surface::LockHandle lock = surface.Lock();

		return Update(real_rect, lock.GetPixels(), lock.GetPitch());
	} else {
		Surface converted = surface.Convert(GetFormat());
		Surface::LockHandle lock = converted.Lock();

		return Update(real_rect, lock.GetPixels(), lock.GetPitch());
	}
}